

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zutil.c
# Opt level: O1

void zCreate_CompCol_Matrix
               (SuperMatrix *A,int m,int n,int_t nnz,doublecomplex *nzval,int_t *rowind,
               int_t *colptr,Stype_t stype,Dtype_t dtype,Mtype_t mtype)

{
  int_t *piVar1;
  void *pvVar2;
  char acStack_138 [264];
  
  A->Stype = stype;
  A->Dtype = dtype;
  A->Mtype = mtype;
  A->nrow = m;
  A->ncol = n;
  pvVar2 = superlu_malloc(0x20);
  A->Store = pvVar2;
  if (pvVar2 == (void *)0x0) {
    sprintf(acStack_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for A->Store",0x33,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zutil.c");
    superlu_abort_and_exit(acStack_138);
  }
  piVar1 = (int_t *)A->Store;
  *piVar1 = nnz;
  *(doublecomplex **)(piVar1 + 2) = nzval;
  *(int_t **)(piVar1 + 4) = rowind;
  *(int_t **)(piVar1 + 6) = colptr;
  return;
}

Assistant:

void
zCreate_CompCol_Matrix(SuperMatrix *A, int m, int n, int_t nnz, 
		       doublecomplex *nzval, int_t *rowind, int_t *colptr,
		       Stype_t stype, Dtype_t dtype, Mtype_t mtype)
{
    NCformat *Astore;

    A->Stype = stype;
    A->Dtype = dtype;
    A->Mtype = mtype;
    A->nrow = m;
    A->ncol = n;
    A->Store = (void *) SUPERLU_MALLOC( sizeof(NCformat) );
    if ( !(A->Store) ) ABORT("SUPERLU_MALLOC fails for A->Store");
    Astore = A->Store;
    Astore->nnz = nnz;
    Astore->nzval = nzval;
    Astore->rowind = rowind;
    Astore->colptr = colptr;
}